

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreateSharedResourcesTest<vkt::api::(anonymous_namespace)::CommandPool>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  deUint32 maxResourceConsumers_;
  CreateThread<vkt::api::(anonymous_namespace)::CommandPool> *this;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_bd [13];
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_b0;
  uint local_9c;
  undefined1 local_98 [4];
  deUint32 ndx;
  ThreadGroup threads;
  undefined1 local_60 [7];
  Resources res;
  Environment env;
  deUint32 numThreads;
  Context *context_local;
  TestStatus *pTStack_10;
  Parameters params_local;
  
  context_local._4_4_ = params.flags;
  pTStack_10 = __return_storage_ptr__;
  maxResourceConsumers_ = getDefaultTestThreadCount();
  Environment::Environment((Environment *)local_60,context,maxResourceConsumers_);
  CommandPool::Resources::Resources
            ((Resources *)&threads.field_0x2f,(Environment *)local_60,
             (Parameters *)((long)&context_local + 4));
  ThreadGroup::ThreadGroup((ThreadGroup *)local_98);
  for (local_9c = 0; local_9c < maxResourceConsumers_; local_9c = local_9c + 1) {
    this = (CreateThread<vkt::api::(anonymous_namespace)::CommandPool> *)operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::CommandPool>::CreateThread
              (this,(Environment *)local_60,(Resources *)&threads.field_0x2f,
               (Parameters *)((long)&context_local + 4));
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter(local_bd)
    ;
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_b0,this);
    ThreadGroup::add((ThreadGroup *)local_98,&local_b0);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_b0);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_98);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreateSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const deUint32						numThreads	= getDefaultTestThreadCount();
	const Environment					env			(context, numThreads);
	const typename Object::Resources	res			(env, params);
	ThreadGroup							threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, res, params)));

	return threads.run();
}